

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGenericHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestGenericHandler::StartResultingXML
          (cmCTestGenericHandler *this,Part part,char *name,cmGeneratedFileStream *xofs)

{
  cmCTest *pcVar1;
  byte bVar2;
  bool bVar3;
  ostream *poVar4;
  char *pcVar5;
  string local_728;
  string local_708 [32];
  string local_6e8 [32];
  undefined1 local_6c8 [8];
  ostringstream cmCTestLog_msg_2;
  string local_550;
  string local_530;
  undefined4 local_50c;
  string local_508 [32];
  undefined1 local_4e8 [8];
  ostringstream cmCTestLog_msg_1;
  string local_370;
  undefined1 local_350 [8];
  ostringstream ostr;
  string local_1d8 [48];
  ostringstream local_1a8 [8];
  ostringstream cmCTestLog_msg;
  cmGeneratedFileStream *xofs_local;
  char *name_local;
  Part part_local;
  cmCTestGenericHandler *this_local;
  
  if (name == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar4 = std::operator<<((ostream *)local_1a8,
                             "Cannot create resulting XML file without providing the name");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestGenericHandler.cxx"
                 ,0x7c,pcVar5,false);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    this_local._7_1_ = false;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_350);
    std::operator<<((ostream *)local_350,name);
    if (0 < this->SubmitIndex) {
      poVar4 = std::operator<<((ostream *)local_350,"_");
      std::ostream::operator<<(poVar4,this->SubmitIndex);
    }
    std::operator<<((ostream *)local_350,".xml");
    cmCTest::GetCurrentTag_abi_cxx11_(&local_370,this->CTest);
    bVar2 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_370);
    if ((bVar2 & 1) == 0) {
      pcVar1 = this->CTest;
      cmCTest::GetCurrentTag_abi_cxx11_(&local_530,pcVar1);
      std::__cxx11::ostringstream::str();
      bVar3 = cmCTest::OpenOutputFile(pcVar1,&local_530,&local_550,xofs,true);
      std::__cxx11::string::~string((string *)&local_550);
      std::__cxx11::string::~string((string *)&local_530);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        cmCTest::AddSubmitFile(pcVar1,part,&local_728);
        std::__cxx11::string::~string((string *)&local_728);
        this_local._7_1_ = true;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6c8);
        poVar4 = std::operator<<((ostream *)local_6c8,"Cannot create resulting XML file: ");
        std::__cxx11::ostringstream::str();
        poVar4 = std::operator<<(poVar4,local_6e8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_6e8);
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestGenericHandler.cxx"
                     ,0x93,pcVar5,false);
        std::__cxx11::string::~string(local_708);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6c8);
        this_local._7_1_ = false;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e8);
      poVar4 = std::operator<<((ostream *)local_4e8,
                               "Current Tag empty, this may mean NightlyStartTime / CTEST_NIGHTLY_START_TIME was not set correctly. Or maybe you forgot to call ctest_start() before calling ctest_configure()."
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestGenericHandler.cxx"
                   ,0x8b,pcVar5,false);
      std::__cxx11::string::~string(local_508);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e8);
      cmSystemTools::SetFatalErrorOccurred();
      this_local._7_1_ = false;
    }
    local_50c = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_350);
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestGenericHandler::StartResultingXML(cmCTest::Part part,
                                              const char* name,
                                              cmGeneratedFileStream& xofs)
{
  if (!name) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create resulting XML file without providing the name"
                 << std::endl;);
    return false;
  }
  std::ostringstream ostr;
  ostr << name;
  if (this->SubmitIndex > 0) {
    ostr << "_" << this->SubmitIndex;
  }
  ostr << ".xml";
  if (this->CTest->GetCurrentTag().empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Current Tag empty, this may mean NightlyStartTime / "
               "CTEST_NIGHTLY_START_TIME was not set correctly. Or "
               "maybe you forgot to call ctest_start() before calling "
               "ctest_configure()."
                 << std::endl);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  if (!this->CTest->OpenOutputFile(this->CTest->GetCurrentTag(), ostr.str(),
                                   xofs, true)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create resulting XML file: " << ostr.str()
                                                    << std::endl);
    return false;
  }
  this->CTest->AddSubmitFile(part, ostr.str());
  return true;
}